

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

ostream * nonius::operator<<(ostream *os,parameters *m)

{
  _Hash_node_base *p_Var1;
  ostream *poVar2;
  
  for (p_Var1 = (m->
                super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
                )._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(char *)p_Var1[1]._M_nxt,(long)p_Var1[2]._M_nxt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    poVar2 = (ostream *)(*(code *)(p_Var1[5]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var1[5]._M_nxt,poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  return os;
}

Assistant:

std::ostream& operator<< (std::ostream& os, const parameters& m) {
        for(auto&& p : m) os << "  " << p.first << " = " << p.second << "\n";
        return os;
    }